

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O0

void __thiscall
flatbuffers::vector_downward<unsigned_int>::fill
          (vector_downward<unsigned_int> *this,size_t zero_pad_bytes)

{
  ulong local_20;
  size_t i;
  size_t zero_pad_bytes_local;
  vector_downward<unsigned_int> *this_local;
  
  make_space(this,zero_pad_bytes);
  for (local_20 = 0; local_20 < zero_pad_bytes; local_20 = local_20 + 1) {
    this->cur_[local_20] = '\0';
  }
  return;
}

Assistant:

void fill(size_t zero_pad_bytes) {
    make_space(zero_pad_bytes);
    for (size_t i = 0; i < zero_pad_bytes; i++) cur_[i] = 0;
  }